

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

void __thiscall stick::Error::Error(Error *this,Int32 _code,ErrorCategory *_category)

{
  Allocator *pAVar1;
  ErrorCategory *_category_local;
  Int32 _code_local;
  Error *this_local;
  
  this->m_category = _category;
  this->m_code = _code;
  pAVar1 = defaultAllocator();
  String::String(&this->m_message,pAVar1);
  pAVar1 = defaultAllocator();
  String::String(&this->m_file,pAVar1);
  return;
}

Assistant:

Error::Error(Int32 _code, const ErrorCategory & _category) : m_category(&_category), m_code(_code)
{
}